

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link-test.cpp
# Opt level: O2

void verify_msg(msg_t read_msg,char *portname,int value,char *test_id,int line)

{
  char *b;
  rtosc_arg_t rVar1;
  string test_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,test_id,(allocator<char> *)&local_68);
  std::operator+(&local_68,&local_48," (portname)");
  assert_str_eq(portname,read_msg,local_68._M_dataplus._M_p,line);
  std::__cxx11::string::~string((string *)&local_68);
  b = rtosc_argument_string(read_msg);
  std::operator+(&local_68,&local_48," (arg type)");
  assert_str_eq("i",b,local_68._M_dataplus._M_p,line);
  std::__cxx11::string::~string((string *)&local_68);
  if ((*b == 'i') && (b[1] == '\0')) {
    rVar1 = rtosc_argument(read_msg,0);
    std::operator+(&local_68,&local_48," (arg value)");
    assert_int_eq(value,rVar1.i,local_68._M_dataplus._M_p,line);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void verify_msg(rtosc::msg_t read_msg, const char *portname, int value, const char *test_id, int line)
{
    const std::string test_string = test_id;

    assert_str_eq(portname, read_msg, (test_string + " (portname)").c_str(), line);
    const char* arg_str = rtosc_argument_string(read_msg);
    assert_str_eq("i", arg_str, (test_string + " (arg type)").c_str(), line);
    if(!strcmp(arg_str, "i"))
        assert_int_eq(value, rtosc_argument(read_msg, 0).i, (test_string + " (arg value)").c_str(), line);
}